

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void dec_build_inter_predictors
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,int plane,MB_MODE_INFO *mi,int build_for_obmc
               ,int bw,int bh,int mi_x,int mi_y)

{
  buf_2d *pbVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  PREDICTION_MODE PVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  MB_MODE_INFO *pMVar10;
  RefCntBuffer *pRVar11;
  uint8_t *dst;
  WarpedMotionParams *pWVar12;
  ushort uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  qm_val_t *pqVar17;
  byte bVar18;
  uint uVar19;
  uint8_t **ppuVar20;
  buf_2d *pbVar21;
  byte bVar22;
  ulong uVar23;
  long lVar24;
  InterpFilterParams *pIVar25;
  bool bVar26;
  MB_MODE_INFO **ppMVar27;
  uint8_t **ppuVar28;
  char cVar29;
  int col;
  long lVar30;
  int x;
  ulong uVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  int local_198;
  int is_global [2];
  WarpTypesAllowed warp_types;
  undefined1 local_130 [56];
  CONV_BUF_TYPE *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  uint local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  InterpFilterParams *local_d0;
  InterpFilterParams *local_c8;
  uint local_c0;
  uint local_bc;
  int local_b8;
  int local_b4;
  uint8_t *local_b0;
  uint8_t *puStack_a8;
  int16_t local_a0 [2];
  int16_t aiStack_9c [2];
  int16_t aaiStack_98 [2] [2];
  int16_t local_90 [2];
  int16_t local_8c [2];
  scale_factors *local_88;
  int local_80;
  uint local_7c;
  uint8_t *local_78;
  qm_val_t *pqStack_70;
  BLOCK_SIZE local_68;
  uint local_64;
  int local_60;
  int local_5c;
  qm_val_t *local_58;
  qm_val_t *local_50;
  qm_val_t *local_48;
  qm_val_t *local_40;
  scale_factors *local_38;
  
  uVar31 = (ulong)mi->bsize;
  uVar7 = *(ushort *)&mi->field_0xa7;
  if ((uVar7 >> 7 & 1) == 0 && build_for_obmc == 0) {
    iVar14 = (dcb->xd).plane[plane].subsampling_x;
    iVar9 = (dcb->xd).plane[plane].subsampling_y;
    bVar18 = (byte)(0x10003L >> (mi->bsize & 0x3f));
    bVar22 = iVar14 != 0 & bVar18;
    bVar26 = iVar9 != 0 && (0x20005UL >> (uVar31 & 0x3f) & 1) != 0;
    if ((bVar22 != 0) || (bVar26)) {
      lVar16 = (long)(dcb->xd).mi_stride;
      lVar24 = -(ulong)bVar22;
      ppMVar27 = (dcb->xd).mi + lVar16 * -(ulong)bVar26;
      lVar30 = lVar24;
      lVar32 = -(ulong)bVar26;
      while (((ppMVar27[lVar30]->field_0xa7 & 0x80) == 0 && ('\0' < ppMVar27[lVar30]->ref_frame[0]))
            ) {
        lVar30 = lVar30 + 1;
        if (lVar30 == 1) {
          ppMVar27 = ppMVar27 + lVar16;
          bVar33 = lVar32 == 0;
          lVar30 = lVar24;
          lVar32 = lVar32 + 1;
          if (bVar33) {
            bVar33 = iVar9 != 0;
            bVar34 = iVar14 != 0;
            bVar22 = block_size_wide[uVar31];
            uVar15 = (uint)(block_size_high[uVar31] >> bVar33);
            BVar2 = av1_ss_size_lookup[uVar31][bVar34][bVar33];
            bVar3 = block_size_high[BVar2];
            cVar5 = mi->ref_frame[1];
            local_198 = -(uint)bVar26;
            bVar18 = bVar18 & bVar34;
            local_58 = (qm_val_t *)(ulong)(uint)((int)(mi_y + (uint)bVar26 * -4) >> bVar33);
            bVar4 = block_size_wide[BVar2];
            local_38 = cm->ref_scale_factors;
            local_40 = (qm_val_t *)((ulong)(plane != 1) * 8 + 0x510);
            local_48 = (qm_val_t *)(ulong)(uint)mi_x;
            local_50 = (qm_val_t *)-(ulong)bVar18;
            uVar19 = 0;
            do {
              iVar14 = (int)local_58;
              uVar31 = 0;
              pqVar17 = local_50;
              do {
                pMVar10 = (dcb->xd).mi
                          [(long)(pqVar17 + (long)local_198 * (long)(dcb->xd).mi_stride)];
                iVar9 = (dcb->xd).plane[plane].dst.stride;
                pRVar11 = cm->ref_frame_map[cm->remapped_ref_idx[(byte)pMVar10->ref_frame[0] - 1]];
                puStack_a8 = *(uint8_t **)(local_40 + (long)pRVar11);
                local_90 = (int16_t  [2])(dcb->xd).plane[plane].subsampling_x;
                local_8c = (int16_t  [2])(dcb->xd).plane[plane].subsampling_y;
                local_80 = (dcb->xd).bd;
                uVar8 = (pMVar10->interp_filters).as_int;
                local_c0 = (uint)(bVar22 >> bVar34);
                local_b4 = ((int)(mi_x + (uint)bVar18 * -4) >> bVar34) + (int)uVar31;
                local_7c = (uint)((dcb->xd).cur_buf)->flags >> 3 & 1;
                uVar7 = *(ushort *)&mi->field_0xa7 >> 7;
                local_64 = uVar7 & 1;
                local_130._0_4_ = 0;
                local_130._4_4_ = 0;
                local_60 = (0x120U >> ((byte)local_8c[0] & 0x1f)) * -0x400 + 0x1000;
                local_5c = (0x120U >> ((byte)local_90[0] & 0x1f)) * -0x400 + 0x1000;
                local_d0 = &av1_intrabc_filter_params;
                local_c8 = &av1_intrabc_filter_params;
                if ((uVar7 & 1) == 0) {
                  uVar23 = (ulong)(uVar8 >> 0xc & 0xff0);
                  pIVar25 = (InterpFilterParams *)
                            ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar23);
                  local_d0 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar23);
                  if ((char)(uVar8 >> 0x10) == '\x04') {
                    local_d0 = pIVar25;
                  }
                  if (4 < local_c0) {
                    local_d0 = pIVar25;
                  }
                  uVar23 = (ulong)((uVar8 & 0xff) << 4);
                  pIVar25 = (InterpFilterParams *)
                            ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar23);
                  local_c8 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar23);
                  if ((char)uVar8 == '\x04') {
                    local_c8 = pIVar25;
                  }
                  if (4 < uVar15) {
                    local_c8 = pIVar25;
                  }
                }
                local_88 = local_38 + cm->remapped_ref_idx[(byte)pMVar10->ref_frame[0] - 1];
                local_b0 = (uint8_t *)0x0;
                aiStack_9c = (int16_t  [2])(pRVar11->buf).field_3.field_0.uv_crop_height;
                local_a0 = (int16_t  [2])(pRVar11->buf).field_2.field_0.uv_crop_width;
                local_e8 = 0x15 - local_80;
                if ('\0' < cVar5) {
                  local_e8 = 7;
                }
                local_ec = local_80 + -7;
                if (local_80 < 0xb) {
                  local_ec = 3;
                }
                aaiStack_98[0] = (int16_t  [2])(pRVar11->buf).field_4.field_0.uv_stride;
                local_130._48_4_ = 0;
                local_f8 = (CONV_BUF_TYPE *)0x0;
                local_f0 = 0;
                if (local_80 < 0xb) {
                  local_e8 = (uint)(cVar5 < '\x01') * 4 + 7;
                }
                local_dc = 0;
                local_e4 = plane;
                local_e0 = (uint)('\0' < cVar5);
                local_bc = uVar15;
                local_b8 = iVar14 + uVar19;
                build_one_inter_predictor
                          ((dcb->xd).plane[plane].dst.buf + uVar31 + (long)(int)(uVar19 * iVar9),
                           iVar9,(MV *)(ulong)pMVar10->mv[0].as_int,
                           (InterPredParams *)(ulong)(pMVar10->mv[0].as_int >> 0x10),
                           (MACROBLOCKD *)local_130,(int)dcb,(int)local_48 + (int)uVar31,
                           mi_y + uVar19,(uint8_t **)0x0);
                uVar31 = uVar31 + (bVar22 >> bVar34);
                pqVar17 = pqVar17 + 1;
              } while (uVar31 < bVar4);
              local_198 = local_198 + 1;
              uVar19 = uVar19 + uVar15;
            } while (uVar19 < bVar3);
            return;
          }
        }
      }
    }
  }
  lVar30 = (long)plane;
  cVar5 = mi->ref_frame[1];
  lVar32 = lVar30 * 0xa30;
  pbVar1 = &(dcb->xd).plane[lVar30].dst;
  dst = pbVar1->buf;
  is_global[0] = 0;
  is_global[1] = 0;
  pWVar12 = (dcb->xd).global_motion;
  PVar6 = mi->mode;
  bVar18 = block_size_high[uVar31];
  if (block_size_wide[uVar31] < block_size_high[uVar31]) {
    bVar18 = block_size_wide[uVar31];
  }
  ppuVar28 = (uint8_t **)((ulong)('\0' < cVar5) + 1);
  ppuVar20 = (uint8_t **)0x0;
  do {
    is_global[(long)ppuVar20] =
         (uint)((7 < bVar18 && (PVar6 - 0xf & 0xf7) == 0) &&
               1 < pWVar12[mi->ref_frame[(long)ppuVar20]].wmtype);
    ppuVar20 = (uint8_t **)((long)ppuVar20 + 1);
  } while (ppuVar28 != ppuVar20);
  iVar14 = (dcb->xd).plane[lVar30].subsampling_x;
  iVar9 = (dcb->xd).plane[lVar30].subsampling_y;
  ppuVar20 = (uint8_t **)0x0;
  do {
    cVar29 = (char)uVar7;
    local_88 = &cm->sf_identity;
    if (-1 < cVar29) {
      local_88 = (dcb->xd).block_ref_scale_factors[(long)ppuVar20];
    }
    pbVar21 = (buf_2d *)((long)&(dcb->xd).plane[0].pre[0].buf + lVar32);
    if (cVar29 < '\0') {
      pbVar21 = pbVar1;
    }
    uVar15 = mi->mv[(long)ppuVar20].as_int;
    warp_types.global_warp_allowed = is_global[(long)ppuVar20];
    warp_types.local_warp_allowed = (int)(mi->motion_mode == '\x02');
    local_90 = (int16_t  [2])(dcb->xd).plane[lVar30].subsampling_x;
    local_8c = (int16_t  [2])(dcb->xd).plane[lVar30].subsampling_y;
    local_80 = (dcb->xd).bd;
    local_7c = (uint)((dcb->xd).cur_buf)->flags >> 3 & 1;
    uVar13 = *(ushort *)&mi->field_0xa7 >> 7;
    local_64 = uVar13 & 1;
    uVar19 = (mi->interp_filters).as_int;
    local_bc = bh;
    local_130._0_4_ = 0;
    local_130._4_4_ = 0;
    local_60 = (0x120U >> ((byte)local_8c[0] & 0x1f)) * -0x400 + 0x1000;
    local_5c = (0x120U >> ((byte)local_90[0] & 0x1f)) * -0x400 + 0x1000;
    local_d0 = &av1_intrabc_filter_params;
    local_c8 = &av1_intrabc_filter_params;
    if ((uVar13 & 1) == 0) {
      uVar23 = (ulong)(uVar19 >> 0xc & 0xff0);
      pIVar25 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar23);
      local_d0 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar23);
      if ((char)(uVar19 >> 0x10) == '\x04') {
        local_d0 = pIVar25;
      }
      if (4 < bw) {
        local_d0 = pIVar25;
      }
      uVar23 = (ulong)((uVar19 & 0xff) << 4);
      pIVar25 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar23);
      local_c8 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar23);
      if ((char)uVar19 == '\x04') {
        local_c8 = pIVar25;
      }
      if (4 < bh) {
        local_c8 = pIVar25;
      }
    }
    local_b0 = pbVar21->buf;
    puStack_a8 = pbVar21->buf0;
    _local_a0 = *(undefined8 *)&pbVar21->width;
    aaiStack_98 = *(int16_t (*) [2] [2])&pbVar21->stride;
    if (cVar5 < '\x01') {
      local_f8 = (dcb->xd).tmp_conv_dst;
      local_e0 = 0;
      if (local_80 < 0xb) {
        local_ec = 3;
        local_e8 = 0xb;
      }
      else {
        local_e8 = 0x15 - local_80;
        local_ec = local_80 + -7;
        local_e0 = 0;
      }
    }
    else {
      local_130._0_4_ = 0;
      local_130._4_4_ = 1;
      local_ec = local_80 + -7;
      if (local_80 < 0xb) {
        local_ec = 3;
      }
      local_f8 = (dcb->xd).tmp_conv_dst;
      local_e8 = 7;
      local_e0 = 1;
    }
    local_f0 = 0x80;
    local_dc = 0;
    local_130._48_4_ = (int)ppuVar20;
    local_e4 = plane;
    local_c0 = bw;
    local_b8 = (int)(mi_y + (uint)(((0x20005UL >> (uVar31 & 0x3f) & 1) != 0 && build_for_obmc == 0)
                                  && iVar9 != 0) * -4) >> ((byte)iVar9 & 0x1f);
    local_b4 = (int)(mi_x + (uint)(((0x10003UL >> (uVar31 & 0x3f) & 1) != 0 && build_for_obmc == 0)
                                  && iVar14 != 0) * -4) >> ((byte)iVar14 & 0x1f);
    av1_dist_wtd_comp_weight_assign(cm,mi,&local_d8,&local_d4,&local_dc,(uint)('\0' < cVar5));
    if (build_for_obmc == 0) {
      av1_init_warp_params((InterPredParams *)local_130,&warp_types,(int)ppuVar20,&dcb->xd,mi);
    }
    if (((mi->interinter_comp).type & 0xfe) == 2) {
      local_68 = mi->bsize;
      pqStack_70 = *(qm_val_t **)&(mi->interinter_comp).wedge_index;
      if (ppuVar20 == (uint8_t **)0x1) {
        local_130._48_4_ = 0;
        local_130._4_4_ = 2;
      }
      local_78 = (dcb->xd).seg_mask;
    }
    build_one_inter_predictor
              (dst,(dcb->xd).plane[lVar30].dst.stride,(MV *)(ulong)uVar15,
               (InterPredParams *)(ulong)(uVar15 >> 0x10),(MACROBLOCKD *)local_130,(int)dcb,mi_x,
               mi_y,ppuVar20);
    ppuVar20 = (uint8_t **)((long)ppuVar20 + 1);
    lVar32 = lVar32 + 0x20;
  } while (ppuVar28 != ppuVar20);
  return;
}

Assistant:

static void dec_build_inter_predictors(const AV1_COMMON *cm,
                                       DecoderCodingBlock *dcb, int plane,
                                       const MB_MODE_INFO *mi,
                                       int build_for_obmc, int bw, int bh,
                                       int mi_x, int mi_y) {
  build_inter_predictors(cm, &dcb->xd, plane, mi, build_for_obmc, bw, bh, mi_x,
                         mi_y, dcb->mc_buf);
}